

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

StackSym * __thiscall GlobOptBlockData::GetCopyPropSym(GlobOptBlockData *this,Sym *sym,Value *value)

{
  code *pcVar1;
  bool bVar2;
  ValueNumber VVar3;
  ValueNumber VVar4;
  ValueInfo *this_00;
  Sym *this_01;
  StackSym *pSVar5;
  undefined4 *puVar6;
  Sym *sym_00;
  Value *this_02;
  Value *copySymVal;
  Sym *copySym;
  ValueInfo *valueInfo;
  Value *value_local;
  Sym *sym_local;
  GlobOptBlockData *this_local;
  
  this_00 = ::Value::GetValueInfo(value);
  this_01 = ValueInfo::GetSymStore(this_00);
  if (((this_01 != (Sym *)0x0) && (bVar2 = Sym::IsStackSym(this_01), bVar2)) && (this_01 != sym)) {
    pSVar5 = Sym::AsStackSym(this_01);
    bVar2 = StackSym::IsTypeSpec(pSVar5);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x5bf,"(!copySym->AsStackSym()->IsTypeSpec())",
                         "!copySym->AsStackSym()->IsTypeSpec()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    sym_00 = ValueInfo::GetSymStore(this_00);
    this_02 = FindValue(this,sym_00);
    if (this_02 != (Value *)0x0) {
      VVar3 = ::Value::GetValueNumber(this_02);
      VVar4 = ::Value::GetValueNumber(value);
      if (VVar3 == VVar4) {
        bVar2 = ValueInfo::IsVarConstant(this_00);
        if ((bVar2) && (bVar2 = IsLive(this,this_01), !bVar2)) {
          return (StackSym *)0x0;
        }
        pSVar5 = Sym::AsStackSym(this_01);
        return pSVar5;
      }
    }
  }
  return (StackSym *)0x0;
}

Assistant:

StackSym *
GlobOptBlockData::GetCopyPropSym(Sym * sym, Value * value)
{
    ValueInfo *valueInfo = value->GetValueInfo();
    Sym * copySym = valueInfo->GetSymStore();

    if (!copySym)
    {
        return nullptr;
    }

    // Only copy prop stackSym, as a propertySym wouldn't improve anything.
    // SingleDef info isn't flow sensitive, so make sure the symbol is actually live.
    if (copySym->IsStackSym() && copySym != sym)
    {
        Assert(!copySym->AsStackSym()->IsTypeSpec());
        Value *copySymVal = this->FindValue(valueInfo->GetSymStore());
        if (copySymVal && copySymVal->GetValueNumber() == value->GetValueNumber())
        {
            if (valueInfo->IsVarConstant() && !this->IsLive(copySym))
            {
                // Because the addrConstantToValueMap isn't flow-based, the symStore of
                // varConstants may not be live.
                return nullptr;
            }
            return copySym->AsStackSym();
        }
    }
    return nullptr;
}